

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O0

void __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::setFromConstTriplets
          (SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *this,Triplets *triplets)

{
  Triplets *in_RDI;
  Triplets copy;
  Triplets *in_stack_00000098;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *in_stack_000000a0;
  Triplets local_28;
  
  Triplets::Triplets(&local_28,in_RDI);
  setFromTriplets(in_stack_000000a0,in_stack_00000098);
  Triplets::~Triplets((Triplets *)0x7776d5);
  return;
}

Assistant:

void SparseMatrix<ordering>::setFromConstTriplets(const iDynTree::Triplets& triplets)
    {
        iDynTree::Triplets copy(triplets);
        setFromTriplets(copy);
    }